

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O0

void ApprovalTests::FileApprover::reportAfterTryingFrontLoadedReporter
               (string *receivedPath,string *approvedPath,Reporter *r)

{
  int iVar1;
  element_type *peVar2;
  long *in_RDX;
  string *in_RSI;
  string *in_RDI;
  shared_ptr<ApprovalTests::Reporter> tryFirst;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [48];
  long *local_18;
  string *local_10;
  string *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  FrontLoadedReporterFactory::getFrontLoadedReporter();
  peVar2 = ::std::
           __shared_ptr_access<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x114e0b);
  ::std::__cxx11::string::string(local_48,local_8);
  ::std::__cxx11::string::string(local_78,local_10);
  iVar1 = (*peVar2->_vptr_Reporter[2])(peVar2,local_48,local_78);
  ::std::__cxx11::string::~string(local_78);
  ::std::__cxx11::string::~string(local_48);
  if ((((byte)iVar1 ^ 0xff) & 1) != 0) {
    ::std::__cxx11::string::string(local_98,local_8);
    ::std::__cxx11::string::string(local_b8,local_10);
    (**(code **)(*local_18 + 0x10))(local_18,local_98,local_b8);
    ::std::__cxx11::string::~string(local_b8);
    ::std::__cxx11::string::~string(local_98);
  }
  ::std::shared_ptr<ApprovalTests::Reporter>::~shared_ptr
            ((shared_ptr<ApprovalTests::Reporter> *)0x114f99);
  return;
}

Assistant:

void
    FileApprover::reportAfterTryingFrontLoadedReporter(const std::string& receivedPath,
                                                       const std::string& approvedPath,
                                                       const Reporter& r)
    {
        auto tryFirst = FrontLoadedReporterFactory::getFrontLoadedReporter();
        if (!tryFirst->report(receivedPath, approvedPath))
        {
            r.report(receivedPath, approvedPath);
        }
    }